

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

bool CoreML::Specification::GLMClassifier_ClassEncoding_Parse
               (ConstStringParam name,GLMClassifier_ClassEncoding *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)GLMClassifier_ClassEncoding_entries,2,local_20,&int_value);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool GLMClassifier_ClassEncoding_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, GLMClassifier_ClassEncoding* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      GLMClassifier_ClassEncoding_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<GLMClassifier_ClassEncoding>(int_value);
  }
  return success;
}